

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

method_info * __thiscall
Frame::getMethodNamed(Frame *this,ClassRuntime *classRuntime,string *name,string *descriptor)

{
  bool bVar1;
  __type _Var2;
  MethodArea *this_00;
  ClassFile *pCVar3;
  Frame *pFVar4;
  char *pcVar5;
  allocator local_d9;
  string local_d8 [8];
  string superClassName;
  allocator local_b1;
  string local_b0 [8];
  string methodDesc;
  allocator local_79;
  string local_78 [8];
  string methodName;
  int local_54;
  int i;
  ClassFile *classFile;
  method_info *method;
  ClassRuntime *currClass;
  MethodArea *methodArea;
  string *descriptor_local;
  string *name_local;
  ClassRuntime *classRuntime_local;
  Frame *this_local;
  
  this_00 = MethodArea::getInstance();
  method = (method_info *)classRuntime;
  do {
    if (method == (method_info *)0x0) {
      return (method_info *)0x0;
    }
    pCVar3 = ClassRuntime::getClassFile((ClassRuntime *)method);
    for (local_54 = 0; local_54 < (int)(uint)pCVar3->methods_count; local_54 = local_54 + 1) {
      pFVar4 = (Frame *)(pCVar3->methods + local_54);
      pcVar5 = getFormattedConstant(pCVar3->constant_pool,*(u2 *)((long)&pFVar4->pc + 2));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,pcVar5,&local_79);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      pcVar5 = getFormattedConstant(pCVar3->constant_pool,*(u2 *)&pFVar4->field_0x4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,pcVar5,&local_b1);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_78,name);
      if ((_Var2) &&
         (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b0,descriptor), _Var2)) {
        this->_classRuntime = (ClassRuntime *)method;
        bVar1 = true;
        this_local = pFVar4;
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_78);
      if (bVar1) {
        return (method_info *)this_local;
      }
    }
    if (pCVar3->super_class == 0) {
      method = (method_info *)0x0;
    }
    else {
      pcVar5 = getFormattedConstant(pCVar3->constant_pool,pCVar3->super_class);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,pcVar5,&local_d9);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      method = (method_info *)MethodArea::loadClassNamed(this_00,(string *)local_d8);
      std::__cxx11::string::~string(local_d8);
    }
  } while( true );
}

Assistant:

method_info* Frame::getMethodNamed(ClassRuntime *classRuntime, string name, string descriptor) {
    MethodArea &methodArea = MethodArea::getInstance();
    
    ClassRuntime *currClass = classRuntime;
    method_info *method;
    
    while (currClass != NULL) {
        ClassFile *classFile = currClass->getClassFile();
        
        for (int i = 0; i < classFile->methods_count; i++) {
            method = &(classFile->methods[i]);
            string methodName = getFormattedConstant(classFile->constant_pool, method->name_index);
            string methodDesc = getFormattedConstant(classFile->constant_pool, method->descriptor_index);
            
            if (methodName == name && methodDesc == descriptor) {
                _classRuntime = currClass;
                return method;
            }
        }
        
        // procurando o método nas super classes.
        if (classFile->super_class == 0) {
            currClass = NULL;
        } else {
            string superClassName = getFormattedConstant(classFile->constant_pool, classFile->super_class);
            currClass = methodArea.loadClassNamed(superClassName);
        }
    }
    
    return NULL;
}